

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int loop(void)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  string command;
  Command cmd;
  string local_d0;
  string local_b0;
  string local_90 [32];
  Command local_70;
  
  do {
    print_prompt();
    get_command_abi_cxx11_();
    std::__cxx11::string::string((string *)&local_b0,local_90);
    Command::Command(&local_70,&local_b0);
    std::__cxx11::string::~string((string *)&local_b0);
    Command::get_command_name_abi_cxx11_(&local_d0,&local_70);
    bVar1 = std::operator==(&local_d0,"exit");
    std::__cxx11::string::~string((string *)&local_d0);
    if (bVar1) {
      Command::~Command(&local_70);
      std::__cxx11::string::~string(local_90);
      return 0;
    }
    iVar2 = Command::execute(&local_70);
    poVar3 = std::operator<<((ostream *)&std::cout,"Return code for [");
    Command::get_command_name_abi_cxx11_(&local_d0,&local_70);
    poVar3 = std::operator<<(poVar3,(string *)&local_d0);
    poVar3 = std::operator<<(poVar3,"] : ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar2);
    std::endl<char,std::char_traits<char>>(poVar3);
    std::__cxx11::string::~string((string *)&local_d0);
    std::ostream::flush();
    Command::~Command(&local_70);
    std::__cxx11::string::~string(local_90);
  } while (!bVar1);
  return 0;
}

Assistant:

int loop()
{
    bool finished(false);
    while (!finished)
    {
        print_prompt();
        std::string command = get_command();
        Command cmd = Command{command};

        if (cmd.get_command_name() == "exit")
        {
            finished = true;
        }
        else
        {
            int return_code = cmd.execute();
            std::cout << "Return code for [" << cmd.get_command_name() << "] : " << return_code << std::endl;
            std::cout.flush();
        }
    }
    return 0;
}